

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_object.cpp
# Opt level: O2

value * __thiscall
mjs::regexp_object::exec(value *__return_storage_ptr__,regexp_object *this,string *str)

{
  regexp_flag rVar1;
  gc_heap *h;
  wchar_t *pwVar2;
  gc_string *pgVar3;
  long *plVar4;
  uint32_t index;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  double dVar8;
  wstring_view wVar9;
  wstring_view wVar10;
  wstring_view pattern;
  regexp local_f0;
  wstring local_c0;
  object_ptr res;
  vector<mjs::regexp_match,_std::allocator<mjs::regexp_match>_> match;
  string_view local_78;
  wchar_t *local_68;
  wstring_view local_60;
  wstring_view local_50;
  gc_heap_ptr_untyped local_40;
  
  rVar1 = this->flags_;
  uVar5 = 0;
  if ((rVar1 & global) != none) {
    value_representation::get_value
              ((value *)&local_f0,&this->last_index_,(this->super_native_object).super_object.heap_)
    ;
    dVar8 = to_integer((value *)&local_f0);
    uVar5 = (uint)dVar8;
    value::~value((value *)&local_f0);
  }
  local_f0.impl_._M_t.
  super___uniq_ptr_impl<mjs::regexp::impl,_std::default_delete<mjs::regexp::impl>_>._M_t.
  super__Tuple_impl<0UL,_mjs::regexp::impl_*,_std::default_delete<mjs::regexp::impl>_>.
  super__Head_base<0UL,_mjs::regexp::impl_*,_false>._M_head_impl._0_4_ = 3;
  local_f0.pattern_._M_dataplus._M_p = (pointer)0x0;
  value_representation::value_representation((value_representation *)&local_c0,(value *)&local_f0);
  (this->last_index_).repr_ = (uint64_t)local_c0._M_dataplus._M_p;
  value::~value((value *)&local_f0);
  if (-1 < (int)uVar5) {
    uVar6 = (ulong)uVar5;
    wVar9 = string::view(str);
    if (uVar6 <= wVar9._M_len) {
      wVar9 = string::view(str);
      wVar10 = string::view(str);
      local_68 = wVar9._M_str;
      pgVar3 = gc_heap_ptr_untracked<mjs::gc_string,_true>::dereference
                         (&this->source_,(this->super_native_object).super_object.heap_);
      pattern._M_len = (ulong)pgVar3->length_;
      pattern._M_str = (wchar_t *)(pgVar3 + 1);
      regexp::regexp(&local_f0,pattern,this->flags_);
      wVar9._M_str = wVar9._M_str + uVar6;
      wVar9._M_len = wVar10._M_len - uVar6;
      regexp::exec(&match,&local_f0,wVar9);
      regexp::~regexp(&local_f0);
      pwVar2 = local_68;
      if (match.super__Vector_base<mjs::regexp_match,_std::allocator<mjs::regexp_match>_>._M_impl.
          super__Vector_impl_data._M_start ==
          match.super__Vector_base<mjs::regexp_match,_std::allocator<mjs::regexp_match>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        value::value(__return_storage_ptr__,(value *)value::null);
      }
      else {
        if ((rVar1 & global) != none) {
          value_representation::value_representation
                    ((value_representation *)&local_f0,
                     (double)((long)(match.
                                     super__Vector_base<mjs::regexp_match,_std::allocator<mjs::regexp_match>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->second -
                              (long)local_68 >> 2));
          (this->last_index_).repr_ =
               CONCAT44(local_f0.impl_._M_t.
                        super___uniq_ptr_impl<mjs::regexp::impl,_std::default_delete<mjs::regexp::impl>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_mjs::regexp::impl_*,_std::default_delete<mjs::regexp::impl>_>
                        .super__Head_base<0UL,_mjs::regexp::impl_*,_false>._M_head_impl._4_4_,
                        local_f0.impl_._M_t.
                        super___uniq_ptr_impl<mjs::regexp::impl,_std::default_delete<mjs::regexp::impl>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_mjs::regexp::impl_*,_std::default_delete<mjs::regexp::impl>_>
                        .super__Head_base<0UL,_mjs::regexp::impl_*,_false>._M_head_impl._0_4_);
        }
        gc_heap_ptr_untracked<mjs::global_object,_true>::track
                  ((gc_heap_ptr_untracked<mjs::global_object,_true> *)&local_f0,
                   (gc_heap *)&(this->super_native_object).field_0x24);
        make_array((gc_heap_ptr<mjs::global_object> *)&res,(uint32_t)&local_f0);
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_f0);
        plVar4 = (long *)gc_heap_ptr_untyped::get(&res.super_gc_heap_ptr_untyped);
        local_78._M_len = 5;
        local_78._M_str = "input";
        string::string((string *)&local_c0,(this->super_native_object).super_object.heap_,&local_78)
        ;
        value::value((value *)&local_f0,str);
        (**(code **)(*plVar4 + 8))(plVar4,&local_c0,&local_f0,0);
        value::~value((value *)&local_f0);
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_c0);
        plVar4 = (long *)gc_heap_ptr_untyped::get(&res.super_gc_heap_ptr_untyped);
        local_78._M_len = 5;
        local_78._M_str = "index";
        string::string((string *)&local_c0,(this->super_native_object).super_object.heap_,&local_78)
        ;
        local_f0.pattern_._M_dataplus._M_p =
             (pointer)(double)((long)(match.
                                      super__Vector_base<mjs::regexp_match,_std::allocator<mjs::regexp_match>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->first -
                               (long)pwVar2 >> 2);
        local_f0.impl_._M_t.
        super___uniq_ptr_impl<mjs::regexp::impl,_std::default_delete<mjs::regexp::impl>_>._M_t.
        super__Tuple_impl<0UL,_mjs::regexp::impl_*,_std::default_delete<mjs::regexp::impl>_>.
        super__Head_base<0UL,_mjs::regexp::impl_*,_false>._M_head_impl._0_4_ = 3;
        (**(code **)(*plVar4 + 8))(plVar4,&local_c0,&local_f0,0);
        value::~value((value *)&local_f0);
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_c0);
        lVar7 = 8;
        for (uVar6 = 0;
            uVar6 < ((ulong)((long)match.
                                   super__Vector_base<mjs::regexp_match,_std::allocator<mjs::regexp_match>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)match.
                                  super__Vector_base<mjs::regexp_match,_std::allocator<mjs::regexp_match>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 4 & 0xffffffff);
            uVar6 = uVar6 + 1) {
          plVar4 = (long *)gc_heap_ptr_untyped::get(&res.super_gc_heap_ptr_untyped);
          h = (this->super_native_object).super_object.heap_;
          index_string_abi_cxx11_(&local_c0,(mjs *)(uVar6 & 0xffffffff),index);
          local_50._M_len = local_c0._M_string_length;
          local_50._M_str = local_c0._M_dataplus._M_p;
          string::string((string *)&local_78,h,&local_50);
          local_60._M_str =
               *(wchar_t **)
                ((long)match.
                       super__Vector_base<mjs::regexp_match,_std::allocator<mjs::regexp_match>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar7 + -8);
          local_60._M_len =
               *(long *)((long)&(match.
                                 super__Vector_base<mjs::regexp_match,_std::allocator<mjs::regexp_match>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->first + lVar7) -
               (long)local_60._M_str >> 2;
          string::string((string *)&local_40,(this->super_native_object).super_object.heap_,
                         &local_60);
          value::value((value *)&local_f0,(string *)&local_40);
          (**(code **)(*plVar4 + 8))(plVar4,&local_78,&local_f0,0);
          value::~value((value *)&local_f0);
          gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_40);
          gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_78);
          std::__cxx11::wstring::~wstring((wstring *)&local_c0);
          lVar7 = lVar7 + 0x10;
        }
        value::value(__return_storage_ptr__,&res);
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&res.super_gc_heap_ptr_untyped);
      }
      std::_Vector_base<mjs::regexp_match,_std::allocator<mjs::regexp_match>_>::~_Vector_base
                (&match.super__Vector_base<mjs::regexp_match,_std::allocator<mjs::regexp_match>_>);
      return __return_storage_ptr__;
    }
  }
  value::value(__return_storage_ptr__,(value *)value::null);
  return __return_storage_ptr__;
}

Assistant:

value exec(const string& str) {
        const bool global = (flags_ & regexp_flag::global) != regexp_flag::none;

        const int32_t start_index = global ? static_cast<int32_t>(to_integer(last_index_.get_value(heap()))) : 0;
        last_index_ = value_representation{value{0.0}};
        if (start_index < 0 || static_cast<size_t>(start_index) > str.view().length()) {
            return value::null;
        }

        const wchar_t* const str_beg = str.view().data();
        const wchar_t* const str_end = str_beg + str.view().length();
        const wchar_t* const search_start = str_beg + start_index;

        const auto match = regexp{source_.dereference(heap()).view(), flags_}.exec(std::wstring_view{search_start, static_cast<size_t>(str_end - search_start)});
        if (match.empty()) {
            return value::null;
        }

        if (global) {
            last_index_ = value_representation{static_cast<double>(match[0].second - str_beg)};
        }

        auto res = make_array(global_.track(heap()), 0);

        res->put(string{heap(), "input"}, value{str});
        res->put(string{heap(), "index"}, value{static_cast<double>(match[0].first - str_beg)});

        for (uint32_t i = 0; i < static_cast<uint32_t>(match.size()); ++i) {
            res->put(string{heap(), index_string(i)}, value{string{heap(), match[i].str()}});
        }

        return value{res};
    }